

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_BinaryErode(BinaryErodeForm2 BinaryErode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Image *image;
  code *in_RDI;
  uint32_t dilationY;
  uint32_t dilationX;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fillData;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined1 local_90 [7];
  uint8_t in_stack_ffffffffffffff77;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  Image *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  undefined1 local_2a;
  undefined1 local_29;
  code *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  uVar2 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  image = (Image *)(ulong)uVar2;
  local_29 = 0;
  __n = &local_2a;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1cda7f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),(size_type)__n,
             (value_type_conflict *)image,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1cdaad);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (value_type_conflict *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Unit_Test::randomImage(in_stack_ffffffffffffff98);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Unit_Test::generateRoi
            (image,(uint32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (uint32_t *)0x1cdb0f);
  bVar1 = Unit_Test::verifyImage
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
  if (bVar1) {
    uVar2 = Test_Helper::randomValue<unsigned_int>
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    uVar3 = Test_Helper::randomValue<unsigned_int>
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    (*local_10)(local_90,local_94,local_98,local_9c,local_a0,uVar2,uVar3);
    local_1 = Unit_Test::verifyImage
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
  }
  else {
    local_1 = true;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cdc85);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cdc8f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return (bool)(local_1 & 1);
}

Assistant:

bool form2_BinaryErode(BinaryErodeForm2 BinaryErode)
    {
        std::vector< uint8_t > fillData( randomValue<uint32_t>(20, 200), 0u );
        fillData.push_back(255u);

        const PenguinV_Image::Image input = randomImage( fillData );
        PenguinV_Image::Image output = input;

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( output, roiX, roiY, roiWidth, roiHeight );
        if ( !verifyImage(output, roiX, roiY, roiWidth, roiHeight, 255u) ) // full ROI is white, nothing to erode
            return true;

        const uint32_t dilationX = randomValue<uint32_t>(1, 5);
        const uint32_t dilationY = randomValue<uint32_t>(1, 5);

        BinaryErode( output, roiX, roiY, roiWidth, roiHeight, dilationX, dilationY );

        return verifyImage( output, roiX, roiY, roiWidth, roiHeight, 0u );
    }